

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O1

void __thiscall PrettyPrinter::visit(PrettyPrinter *this,BinaryExpr *node)

{
  Expr *pEVar1;
  ostream *poVar2;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
  tokTypeToString_abi_cxx11_(&local_40,node->m_op);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pEVar1 = (node->m_left)._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
           super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl;
  (*(pEVar1->super_Stmt)._vptr_Stmt[2])(pEVar1,this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  pEVar1 = (node->m_right)._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
           super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl;
  (*(pEVar1->super_Stmt)._vptr_Stmt[2])(pEVar1,this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
  return;
}

Assistant:

void PrettyPrinter::visit(AST::BinaryExpr *node) {
    std::cout << "(";
    std::cout << tokTypeToString(node->m_op) << " ";
    node->m_left->accept(this);
    std::cout << " ";
    node->m_right->accept(this);
    std::cout << ")";
}